

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_39fc::ProfileHandlerTest_MultipleCallbacks_Test::TestBody
          (ProfileHandlerTest_MultipleCallbacks_Test *this)

{
  ProfileHandlerTest *this_00;
  ProfileHandlerTest *this_01;
  ProfileHandlerTest *pPVar1;
  ProfileHandlerTest *tick_counter;
  ProfileHandlerToken *pPVar2;
  char *pcVar3;
  undefined1 local_60 [8];
  int first_tick_count;
  int second_tick_count;
  ProfileHandlerState state;
  AssertionResult gtest_ar;
  
  local_60._0_4_ = 0;
  pPVar1 = (ProfileHandlerTest *)local_60;
  this_00 = (ProfileHandlerTest *)
            ProfileHandlerRegisterCallback(TickCounter,(ProfileHandlerTest *)local_60);
  Delay(5000000);
  ProfileHandlerTest::VerifyRegistration((ProfileHandlerTest *)local_60,(int *)pPVar1);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  ProfileHandlerGetState((ProfileHandlerState *)&first_tick_count);
  first_tick_count = second_tick_count;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&state.allowed,"1","GetCallbackCount()",(int *)&gtest_ar.message_,
             (uint *)&first_tick_count);
  if (state.allowed == false) {
    testing::Message::Message((Message *)&first_tick_count);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x163,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&first_tick_count);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)CONCAT44(second_tick_count,first_tick_count) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(second_tick_count,first_tick_count) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  pPVar1 = (ProfileHandlerTest *)(local_60 + 4);
  local_60._4_4_ = 0;
  tick_counter = pPVar1;
  this_01 = (ProfileHandlerTest *)ProfileHandlerRegisterCallback(TickCounter,pPVar1);
  Delay(5000000);
  ProfileHandlerTest::VerifyRegistration(pPVar1,(int *)tick_counter);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  ProfileHandlerGetState((ProfileHandlerState *)&first_tick_count);
  first_tick_count = second_tick_count;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&state.allowed,"2","GetCallbackCount()",(int *)&gtest_ar.message_,
             (uint *)&first_tick_count);
  if (state.allowed == false) {
    testing::Message::Message((Message *)&first_tick_count);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x16a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&first_tick_count);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)CONCAT44(second_tick_count,first_tick_count) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(second_tick_count,first_tick_count) + 8))();
    }
  }
  pPVar2 = (ProfileHandlerToken *)gtest_ar._0_8_;
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  ProfileHandlerTest::UnregisterCallback(this_00,pPVar2);
  ProfileHandlerTest::VerifyUnregistration((ProfileHandlerTest *)local_60,(int *)pPVar2);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  ProfileHandlerGetState((ProfileHandlerState *)&first_tick_count);
  first_tick_count = second_tick_count;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&state.allowed,"1","GetCallbackCount()",(int *)&gtest_ar.message_,
             (uint *)&first_tick_count);
  if (state.allowed == false) {
    testing::Message::Message((Message *)&first_tick_count);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x16f,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&first_tick_count);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)CONCAT44(second_tick_count,first_tick_count) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(second_tick_count,first_tick_count) + 8))();
    }
  }
  pPVar2 = (ProfileHandlerToken *)gtest_ar._0_8_;
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  ProfileHandlerTest::VerifyRegistration((ProfileHandlerTest *)(local_60 + 4),(int *)pPVar2);
  ProfileHandlerTest::UnregisterCallback(this_01,pPVar2);
  ProfileHandlerTest::VerifyUnregistration((ProfileHandlerTest *)(local_60 + 4),(int *)pPVar2);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  ProfileHandlerGetState((ProfileHandlerState *)&first_tick_count);
  first_tick_count = second_tick_count;
  pPVar1 = (ProfileHandlerTest *)&state.allowed;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)pPVar1,"0","GetCallbackCount()",(int *)&gtest_ar.message_,
             (uint *)&first_tick_count);
  if (state.allowed == false) {
    testing::Message::Message((Message *)&first_tick_count);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x176,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&first_tick_count);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    pPVar1 = (ProfileHandlerTest *)CONCAT44(second_tick_count,first_tick_count);
    if (pPVar1 != (ProfileHandlerTest *)0x0) {
      (*(pPVar1->super_Test)._vptr_Test[1])();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    pPVar1 = (ProfileHandlerTest *)&gtest_ar;
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pPVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if ((anonymous_namespace)::linux_per_thread_timers_mode_ == '\0') {
    ProfileHandlerTest::VerifyDisabled(pPVar1);
  }
  return;
}

Assistant:

TEST_F(ProfileHandlerTest, MultipleCallbacks) {
  // Register first callback.
  int first_tick_count = 0;
  ProfileHandlerToken* token1 = RegisterCallback(&first_tick_count);
  // Check that callback was registered correctly.
  VerifyRegistration(first_tick_count);
  EXPECT_EQ(1, GetCallbackCount());

  // Register second callback.
  int second_tick_count = 0;
  ProfileHandlerToken* token2 = RegisterCallback(&second_tick_count);
  // Check that callback was registered correctly.
  VerifyRegistration(second_tick_count);
  EXPECT_EQ(2, GetCallbackCount());

  // Unregister first callback.
  UnregisterCallback(token1);
  VerifyUnregistration(first_tick_count);
  EXPECT_EQ(1, GetCallbackCount());
  // Verify that second callback is still registered.
  VerifyRegistration(second_tick_count);

  // Unregister second callback.
  UnregisterCallback(token2);
  VerifyUnregistration(second_tick_count);
  EXPECT_EQ(0, GetCallbackCount());

  // Verify that the timers is correctly disabled.
  if (!linux_per_thread_timers_mode_) VerifyDisabled();
}